

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CastlingRights.h
# Opt level: O0

CastlingRight libchess::CastlingRight::from(char c)

{
  CastlingRight *this;
  char in_DIL;
  value_type in_stack_ffffffffffffffec;
  MetaValueType<int> local_4;
  
  this = (CastlingRight *)(ulong)((int)in_DIL - 0x4b);
  switch(this) {
  case (CastlingRight *)0x0:
    CastlingRight(this,in_stack_ffffffffffffffec);
    break;
  default:
    CastlingRight(this,in_stack_ffffffffffffffec);
    break;
  case (CastlingRight *)0x6:
    CastlingRight(this,in_stack_ffffffffffffffec);
    break;
  case (CastlingRight *)0x20:
    CastlingRight(this,in_stack_ffffffffffffffec);
    break;
  case (CastlingRight *)0x26:
    CastlingRight(this,in_stack_ffffffffffffffec);
  }
  return (MetaValueType<int>)(MetaValueType<int>)local_4.value_;
}

Assistant:

constexpr static CastlingRight from(char c) {
        switch (c) {
        case 'K':
            return CastlingRight{Value::WHITE_KINGSIDE};
        case 'Q':
            return CastlingRight{Value::WHITE_QUEENSIDE};
        case 'k':
            return CastlingRight{Value::BLACK_KINGSIDE};
        case 'q':
            return CastlingRight{Value::BLACK_QUEENSIDE};
        default:
            return CastlingRight{Value::CASTLING_RIGHT_NONE};
        }
    }